

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void EDLines::LineFit(double *x,double *y,int count,double *a,double *b,double *e,int *invert)

{
  double dVar1;
  double dVar2;
  double dist;
  double y2;
  double x2;
  double c;
  double d_1;
  double dStack_c8;
  int i_4;
  double error_1;
  double dStack_b8;
  int i_3;
  double error;
  double D;
  int i_2;
  double d;
  double *t;
  double dStack_88;
  int i_1;
  double dy;
  double dx;
  double my;
  double mx;
  double dStack_60;
  int i;
  double Sxy;
  double Sxx;
  double Sy;
  double Sx;
  double S;
  double *e_local;
  double *b_local;
  double *a_local;
  double *pdStack_18;
  int count_local;
  double *y_local;
  double *x_local;
  
  if (1 < count) {
    Sy = 0.0;
    Sxx = 0.0;
    Sxy = 0.0;
    dStack_60 = 0.0;
    for (mx._4_4_ = 0; dVar1 = Sy, mx._4_4_ < count; mx._4_4_ = mx._4_4_ + 1) {
      Sy = x[mx._4_4_] + Sy;
      Sxx = y[mx._4_4_] + Sxx;
    }
    dy = 0.0;
    dStack_88 = 0.0;
    for (t._4_4_ = 0; t._4_4_ < count; t._4_4_ = t._4_4_ + 1) {
      dy = (x[t._4_4_] - Sy / (double)count) * (x[t._4_4_] - Sy / (double)count) + dy;
      dStack_88 = (y[t._4_4_] - Sxx / (double)count) * (y[t._4_4_] - Sxx / (double)count) +
                  dStack_88;
    }
    if (dStack_88 <= dy) {
      *invert = 0;
      pdStack_18 = y;
      y_local = x;
    }
    else {
      *invert = 1;
      Sy = Sxx;
      Sxx = dVar1;
      pdStack_18 = x;
      y_local = y;
    }
    for (D._4_4_ = 0; D._4_4_ < count; D._4_4_ = D._4_4_ + 1) {
      Sxy = y_local[D._4_4_] * y_local[D._4_4_] + Sxy;
      dStack_60 = y_local[D._4_4_] * pdStack_18[D._4_4_] + dStack_60;
    }
    dVar1 = (double)count * Sxy + -(Sy * Sy);
    *a = (Sxy * Sxx + -(Sy * dStack_60)) / dVar1;
    *b = ((double)count * dStack_60 + -(Sy * Sxx)) / dVar1;
    if ((*b != 0.0) || (NAN(*b))) {
      dStack_c8 = 0.0;
      for (d_1._4_4_ = 0; d_1._4_4_ < count; d_1._4_4_ = d_1._4_4_ + 1) {
        dVar1 = (*a - (-(-1.0 / *b) * y_local[d_1._4_4_] + pdStack_18[d_1._4_4_])) /
                (-1.0 / *b - *b);
        dVar2 = *b * dVar1 + *a;
        dStack_c8 = (y_local[d_1._4_4_] - dVar1) * (y_local[d_1._4_4_] - dVar1) +
                    (pdStack_18[d_1._4_4_] - dVar2) * (pdStack_18[d_1._4_4_] - dVar2) + dStack_c8;
      }
      dVar1 = sqrt(dStack_c8 / (double)count);
      *e = dVar1;
    }
    else {
      dStack_b8 = 0.0;
      for (error_1._4_4_ = 0; error_1._4_4_ < count; error_1._4_4_ = error_1._4_4_ + 1) {
        dStack_b8 = ABS(*a - pdStack_18[error_1._4_4_]) + dStack_b8;
      }
      *e = dStack_b8 / (double)count;
    }
  }
  return;
}

Assistant:

void EDLines::LineFit(double * x, double * y, int count, double &a, double &b, double &e, int &invert)
{
	if (count<2) return;

	double S = count, Sx = 0.0, Sy = 0.0, Sxx = 0.0, Sxy = 0.0;
	for (int i = 0; i<count; i++) {
		Sx += x[i];
		Sy += y[i];
	} //end-for

	double mx = Sx / count;
	double my = Sy / count;

	double dx = 0.0;
	double dy = 0.0;
	for (int i = 0; i < count; i++) {
		dx += (x[i] - mx)*(x[i] - mx);
		dy += (y[i] - my)*(y[i] - my);
	} //end-for

	if (dx < dy) {
		// Vertical line. Swap x & y, Sx & Sy
		invert = 1;
		double *t = x;
		x = y;
		y = t;

		double d = Sx;
		Sx = Sy;
		Sy = d;

	}
	else {
		invert = 0;
	} //end-else  

	  // Now compute Sxx & Sxy
	for (int i = 0; i<count; i++) {
		Sxx += x[i] * x[i];
		Sxy += x[i] * y[i];
	} //end-for

	double D = S*Sxx - Sx*Sx;
	a = (Sxx*Sy - Sx*Sxy) / D;
	b = (S  *Sxy - Sx* Sy) / D;

	if (b == 0.0) {
		// Vertical or horizontal line
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			error += fabs((a) - y[i]);
		} //end-for
		e = error / count;

	}
	else {
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			// Let the line passing through (x[i], y[i]) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y[i] - d*x[i];
			double x2 = ((a) - c) / (d - (b));
			double y2 = (a) + (b)*x2;

			double dist = (x[i] - x2)*(x[i] - x2) + (y[i] - y2)*(y[i] - y2);
			error += dist;
		} //end-for

		e = sqrt(error / count);
	} //end-else
}